

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLDateTime.cpp
# Opt level: O3

XMLCh * __thiscall
xercesc_4_0::XMLDateTime::getDateCanonicalRepresentation(XMLDateTime *this,MemoryManager *memMgr)

{
  uint uVar1;
  XMLCh *pXVar2;
  MemoryManager *pMVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  div_t dVar7;
  undefined4 extraout_var_01;
  uint value;
  uint uVar8;
  long lVar9;
  uint value_00;
  uint uVar10;
  XMLCh *local_60;
  int local_58;
  int local_54;
  XMLCh *local_50;
  int local_44;
  XMLDateTime *local_40;
  MemoryManager *local_38;
  XMLCh *__dest;
  
  iVar6 = this->fValue[7];
  uVar10 = (uint)(iVar6 == 0);
  uVar1 = uVar10 ^ 0x11;
  if (this->fTimeZone[1] == 0 && this->fTimeZone[0] == 0) {
    uVar1 = 0xc - uVar10;
  }
  if (memMgr == (MemoryManager *)0x0) {
    memMgr = this->fMemoryManager;
  }
  iVar4 = (*memMgr->_vptr_MemoryManager[3])(memMgr,(ulong)(uVar1 * 2));
  local_60 = (XMLCh *)CONCAT44(extraout_var,iVar4);
  local_50 = local_60;
  if (0xb < this->fValue[3]) {
    local_44 = this->fValue[4];
    local_58 = 0x3c - local_44;
    local_54 = -this->fValue[3] - (uint)(local_44 != 0);
    value = this->fValue[2] + 1;
    uVar10 = this->fValue[0];
    value_00 = this->fValue[1];
    local_40 = this;
    local_38 = memMgr;
    do {
      if (value_00 < 0xc) {
        uVar8 = 0x1e;
        if ((0xa50U >> (value_00 & 0x1f) & 1) == 0) {
          if (value_00 != 2) goto LAB_0024df9e;
          uVar8 = 0x1c;
          if ((uVar10 & 3) == 0) {
            uVar8 = uVar10 * -0x3d70a3d7 + 0x51eb850;
            uVar8 = ((uVar8 >> 4 | uVar10 * -0x70000000) < 0xa3d70b ||
                    0x28f5c28 < (uVar8 >> 2 | uVar10 * 0x40000000)) | 0x1c;
          }
        }
      }
      else {
LAB_0024df9e:
        uVar8 = 0x1f;
      }
      if ((int)value < 1) {
        if (value_00 < 0xd) {
          uVar8 = 0x1e;
          if ((0x14a0U >> (value_00 & 0x1f) & 1) == 0) {
            if (value_00 != 3) goto LAB_0024dfef;
            uVar8 = 0x1c;
            if ((uVar10 & 3) == 0) {
              uVar8 = uVar10 * -0x3d70a3d7 + 0x51eb850;
              uVar8 = ((uVar8 >> 4 | uVar10 * -0x70000000) < 0xa3d70b ||
                      0x28f5c28 < (uVar8 >> 2 | uVar10 * 0x40000000)) | 0x1c;
            }
          }
        }
        else {
LAB_0024dfef:
          uVar8 = 0x1f;
        }
        value = uVar8 + value;
        iVar6 = -1;
      }
      else {
        if (value < uVar8 || value - uVar8 == 0) goto LAB_0024dff9;
        iVar6 = 1;
        value = value - uVar8;
      }
      dVar7 = div(iVar6 + value_00 + -1,0xc);
      uVar8 = iVar6 + value_00 + dVar7.quot * -0xc;
      value_00 = uVar8 + 0xc;
      if (0 < (int)uVar8) {
        value_00 = uVar8;
      }
      uVar10 = (uVar10 + dVar7.quot) - (uint)((int)uVar8 < 1);
    } while( true );
  }
  iVar4 = fillYearString(this,&local_60,this->fValue[0]);
  __dest = local_50;
  if (iVar4 != 0) {
    iVar5 = (*memMgr->_vptr_MemoryManager[3])(memMgr,(long)(int)(uVar1 + iVar4) * 2);
    pXVar2 = local_50;
    __dest = (XMLCh *)CONCAT44(extraout_var_00,iVar5);
    memmove(__dest,local_50,(long)iVar4 * 2 + 8);
    lVar9 = (long)local_60 - (long)pXVar2;
    (*memMgr->_vptr_MemoryManager[4])(memMgr,pXVar2);
    local_60 = (XMLCh *)(lVar9 + (long)__dest);
  }
  *local_60 = L'-';
  local_60 = local_60 + 1;
  fillString(this,&local_60,this->fValue[1],2);
  *local_60 = L'-';
  local_60 = local_60 + 1;
  fillString(this,&local_60,this->fValue[2],2);
  if (iVar6 == 0) goto LAB_0024e1d9;
  if (this->fTimeZone[1] == 0 && this->fTimeZone[0] == 0) {
    *local_60 = L'Z';
    local_60 = local_60 + 1;
    goto LAB_0024e1d9;
  }
  *local_60 = L'-';
  local_60 = local_60 + 1;
  fillString(this,&local_60,this->fValue[3],2);
  *local_60 = L':';
  iVar6 = this->fValue[4];
LAB_0024e1d4:
  local_60 = local_60 + 1;
  fillString(this,&local_60,iVar6,2);
LAB_0024e1d9:
  *local_60 = L'\0';
  return __dest;
LAB_0024dff9:
  if (local_44 == 0) {
    local_58 = 0;
  }
  local_54 = local_54 + 0x18;
  iVar6 = fillYearString(local_40,&local_60,uVar10);
  pMVar3 = local_38;
  __dest = local_50;
  if (iVar6 != 0) {
    iVar4 = (*local_38->_vptr_MemoryManager[3])(local_38,(long)(int)(uVar1 + iVar6) * 2);
    pXVar2 = local_50;
    __dest = (XMLCh *)CONCAT44(extraout_var_01,iVar4);
    memmove(__dest,local_50,(long)iVar6 * 2 + 8);
    lVar9 = (long)local_60 - (long)pXVar2;
    (*pMVar3->_vptr_MemoryManager[4])(pMVar3,pXVar2);
    local_60 = (XMLCh *)(lVar9 + (long)__dest);
  }
  this = local_40;
  *local_60 = L'-';
  local_60 = local_60 + 1;
  fillString(local_40,&local_60,value_00,2);
  *local_60 = L'-';
  local_60 = local_60 + 1;
  fillString(this,&local_60,value,2);
  *local_60 = L'+';
  local_60 = local_60 + 1;
  fillString(this,&local_60,local_54,2);
  *local_60 = L':';
  iVar6 = local_58;
  goto LAB_0024e1d4;
}

Assistant:

XMLCh* XMLDateTime::getDateCanonicalRepresentation(MemoryManager* const memMgr) const
{
    /*
     * Case Date               Actual Value    Canonical Value
     *    1 yyyy-mm-dd         yyyy-mm-dd          yyyy-mm-dd
     *    2 yyyy-mm-ddZ        yyyy-mm-ddT00:00Z   yyyy-mm-ddZ
     *    3 yyyy-mm-dd+00:00   yyyy-mm-ddT00:00Z   yyyy-mm-ddZ
     *    4 yyyy-mm-dd+00:01   YYYY-MM-DCT23:59Z   yyyy-mm-dd+00:01
     *    5 yyyy-mm-dd+12:00   YYYY-MM-DCT12:00Z   yyyy-mm-dd+12:00
     *    6 yyyy-mm-dd+12:01   YYYY-MM-DCT11:59Z   YYYY-MM-DC-11:59
     *    7 yyyy-mm-dd+14:00   YYYY-MM-DCT10:00Z   YYYY-MM-DC-10:00
     *    8 yyyy-mm-dd-00:00   yyyy-mm-ddT00:00Z   yyyy-mm-ddZ
     *    9 yyyy-mm-dd-00:01   yyyy-mm-ddT00:01Z   yyyy-mm-dd-00:01
     *   11 yyyy-mm-dd-11:59   yyyy-mm-ddT11:59Z   YYYY-MM-DD-11:59
     *   10 yyyy-mm-dd-12:00   yyyy-mm-ddT12:00Z   YYYY-MM-DD+12:00
     *   12 yyyy-mm-dd-14:00   yyyy-mm-ddT14:00Z   YYYY-MM-DD+10:00
     */
    int utcSize = (fValue[utc] == UTC_UNKNOWN) ? 0 : 1;
    // YYYY-MM-DD  + chNull
    // 1234567890  + 1
    int memLength = 10 + 1 + utcSize;

    if (fTimeZone[hh] != 0 || fTimeZone[mm] != 0) {
        // YYYY-MM-DD+HH:MM  (utcSize will be 1 so drop that)
        // 1234567890123456
        memLength += 5; // 6 - 1 for utcSize
    }

    MemoryManager* toUse = memMgr? memMgr : fMemoryManager;
    XMLCh* retBuf = (XMLCh*) toUse->allocate( (memLength) * sizeof(XMLCh));
    XMLCh* retPtr = retBuf;

    if (fValue[Hour] < 12) {

        int additionalLen = fillYearString(retPtr, fValue[CentYear]);
        if (additionalLen != 0) {
            // very bad luck; have to resize the buffer...
            XMLCh *tmpBuf = (XMLCh*) toUse->allocate( (additionalLen + memLength ) * sizeof(XMLCh));
            XMLString::moveChars(tmpBuf, retBuf, 4+additionalLen);
            retPtr = tmpBuf+(retPtr-retBuf);
            toUse->deallocate(retBuf);
            retBuf = tmpBuf;
        }
        *retPtr++ = DATE_SEPARATOR;
        fillString(retPtr, fValue[Month], 2);
        *retPtr++ = DATE_SEPARATOR;
        fillString(retPtr, fValue[Day], 2);

        if (utcSize) {
            if (fTimeZone[hh] != 0 || fTimeZone[mm] != 0) {
                *retPtr++ = UTC_NEG_CHAR;
                fillString(retPtr, fValue[Hour], 2);
                *retPtr++ = TIME_SEPARATOR;
                fillString(retPtr, fValue[Minute], 2);
            }
            else {
                *retPtr++ = UTC_STD_CHAR;
            }
        }
        *retPtr = chNull;
    }
    else {
        /*
         * Need to reconvert things to get a recoverable time zone between
         * +12:00 and -11:59
         */
        int carry;
        int minute;
        int hour;
        int day;
        int month;
        int year;
        if (fValue[Minute] == 0) {
            minute = 0;
            carry = 0;
        }
        else {
            minute = 60 - fValue[Minute];
            carry = 1;
        }
        hour  = 24 - fValue[Hour] - carry;
        day   = fValue[Day] + 1;
        month = fValue[Month];
        year  = fValue[CentYear];

        while (1) {
            int temp = maxDayInMonthFor(year, month);
            if (day < 1) {
                day += maxDayInMonthFor(year, month - 1);
                carry = -1;
            }
            else if (day > temp) {
                day -= temp;
                carry = 1;
            }
            else {
                break;
            }

            temp = month + carry;
            month = modulo(temp, 1, 13);
            if (month <= 0) {
                month+= 12;
                year--;
            }
            year += fQuotient(temp, 1, 13);
        }

        int additionalLen = fillYearString(retPtr, year);
        if (additionalLen != 0) {
            // very bad luck; have to resize the buffer...
            XMLCh *tmpBuf = (XMLCh*) toUse->allocate( (additionalLen + memLength ) * sizeof(XMLCh));
            XMLString::moveChars(tmpBuf, retBuf, 4+additionalLen);
            retPtr = tmpBuf+(retPtr-retBuf);
            toUse->deallocate(retBuf);
            retBuf = tmpBuf;
        }
        *retPtr++ = DATE_SEPARATOR;
        fillString(retPtr, month, 2);
        *retPtr++ = DATE_SEPARATOR;
        fillString(retPtr, day, 2);

        *retPtr++ = UTC_POS_CHAR;
        fillString(retPtr, hour, 2);
        *retPtr++ = TIME_SEPARATOR;
        fillString(retPtr, minute, 2);
        *retPtr = chNull;
    }
    return retBuf;
}